

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O2

void __thiscall
SSTableCache::SSTableCache
          (SSTableCache *this,SkipList *memTable,uint64_t timeStamp,string *_fileName)

{
  bool bVar1;
  unsigned_long uVar2;
  uint64_t uVar3;
  uint64_t *__args;
  string *psVar4;
  ConstIterator i;
  uint local_40 [2];
  ConstIterator local_38;
  
  (this->index).
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->index).
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->header).minKey = 0;
  (this->header).maxKey = 0;
  (this->header).timeStamp = 0;
  (this->header).length = 0;
  (this->index).
  super__Vector_base<std::pair<unsigned_long,_int>,_std::allocator<std::pair<unsigned_long,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  BloomFilter::BloomFilter(&this->bloomFilter,memTable);
  std::__cxx11::string::string((string *)&this->fileName,(string *)_fileName);
  uVar2 = SkipList::getLength(memTable);
  (this->header).length = uVar2;
  uVar3 = SkipList::getMinKey(memTable);
  (this->header).minKey = uVar3;
  uVar3 = SkipList::getMaxKey(memTable);
  (this->header).maxKey = uVar3;
  (this->header).timeStamp = timeStamp;
  local_38 = SkipList::constBegin(memTable);
  local_40[0] = 0;
  while( true ) {
    bVar1 = SkipList::ConstIterator::hasNext(&local_38);
    if (!bVar1) break;
    SkipList::ConstIterator::next(&local_38);
    __args = SkipList::ConstIterator::key(&local_38);
    std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
    emplace_back<unsigned_long_const&,unsigned_int&>
              ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
               &this->index,__args,local_40);
    psVar4 = SkipList::ConstIterator::value_abi_cxx11_(&local_38);
    local_40[0] = local_40[0] + (int)psVar4->_M_string_length;
  }
  local_40[1] = 0;
  std::vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>>::
  emplace_back<int,unsigned_int&>
            ((vector<std::pair<unsigned_long,int>,std::allocator<std::pair<unsigned_long,int>>> *)
             &this->index,(int *)(local_40 + 1),local_40);
  return;
}

Assistant:

SSTableCache::SSTableCache(const SkipList &memTable, uint64_t timeStamp,
                           string _fileName)
    : bloomFilter(memTable), fileName(std::move(_fileName)) {
  header.length = memTable.getLength();
  header.minKey = memTable.getMinKey();
  header.maxKey = memTable.getMaxKey();
  header.timeStamp = timeStamp;

  auto i = memTable.constBegin();
  uint32_t offset = 0;
  while (i.hasNext()) {
    i.next();
    index.emplace_back(i.key(), offset);
    offset += i.value().size();
  }
  index.emplace_back(0, offset);
}